

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall PFData_test_setData_Test::TestBody(PFData_test_setData_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  AssertHelper *this_00;
  char *lhs_expression;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  PFData test_read;
  int i;
  double data [24];
  PFData test;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  int *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  char *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  Type in_stack_fffffffffffffa5c;
  Type type;
  PFData *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  PFData *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffaac;
  AssertHelper *in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  PFData *in_stack_fffffffffffffb08;
  AssertionResult local_4a8;
  undefined1 local_490 [8];
  char *local_488;
  undefined4 local_47c;
  AssertionResult local_478 [2];
  AssertHelper *local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  double local_428;
  undefined4 local_41c;
  AssertionResult local_418 [2];
  int local_3f8;
  undefined4 local_3f4;
  AssertionResult local_3f0 [2];
  int local_3d0;
  undefined4 local_3cc;
  AssertionResult local_3c8 [2];
  int local_3a8;
  undefined4 local_3a4;
  AssertionResult local_3a0 [2];
  double local_380;
  undefined4 local_374;
  AssertionResult local_370 [2];
  double local_350;
  undefined4 local_344;
  AssertionResult local_340 [2];
  double local_320;
  undefined4 local_314;
  AssertionResult local_310 [2];
  int local_2f0;
  undefined4 local_2ec;
  AssertionResult local_2e8 [2];
  int local_2c8;
  undefined4 local_2c4;
  AssertionResult local_2c0 [2];
  int local_2a0;
  undefined4 local_29c;
  AssertionResult local_298;
  allocator local_281;
  string local_280 [32];
  PFData local_260;
  allocator local_1b1;
  string local_1b0 [52];
  int local_17c;
  double local_178 [25];
  PFData local_b0;
  
  memset(&local_b0,0,0xa8);
  PFData::PFData(in_stack_fffffffffffffa60);
  for (local_17c = 0; local_17c < 0x18; local_17c = local_17c + 1) {
    iVar4 = rand();
    local_178[local_17c] = (double)iVar4 / 1000.0;
  }
  PFData::setR(&local_b0,1);
  PFData::setQ(&local_b0,1);
  PFData::setP(&local_b0,1);
  PFData::setDZ(&local_b0,1.0);
  PFData::setDY(&local_b0,1.0);
  PFData::setDX(&local_b0,1.0);
  PFData::setNZ(&local_b0,1);
  PFData::setNY(&local_b0,4);
  PFData::setNX(&local_b0,6);
  PFData::setData(&local_b0,local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"tests/test_write_file_out.pfb",&local_1b1);
  PFData::writeFile(in_stack_fffffffffffffaa0,
                    (string *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"tests/test_write_file_out.pfb",&local_281);
  PFData::PFData(in_stack_fffffffffffffa60,
                 (string *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  PFData::loadHeader(in_stack_fffffffffffffb08);
  PFData::loadData((PFData *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
  local_29c = 1;
  local_2a0 = PFData::getR(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x127898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,
               (Message *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x1278fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127953);
  local_2c4 = 1;
  local_2c8 = PFData::getQ(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x127a1e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,
               (Message *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x127a81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127ad9);
  local_2ec = 1;
  local_2f0 = PFData::getP(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x127ba4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,
               (Message *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x127c07);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127c5f);
  local_314 = 1;
  local_320 = PFData::getDZ(&local_260);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (double *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x127d30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,
               (Message *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x127d93);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127deb);
  local_344 = 1;
  local_350 = PFData::getDY(&local_260);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (double *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x127ebc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,
               (Message *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x127f1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127f77);
  local_374 = 1;
  local_380 = PFData::getDX(&local_260);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (double *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    in_stack_fffffffffffffab0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x128048);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,
               (Message *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x1280ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128103);
  local_3a4 = 1;
  iVar4 = PFData::getNZ(&local_260);
  local_3a8 = iVar4;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a0);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffaa8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x1281ce);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x12822b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128283);
  local_3cc = 4;
  local_3d0 = PFData::getNY(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x128342);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x12839f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1283f7);
  local_3f4 = 6;
  local_3f8 = PFData::getNX(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x1284b6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x128513);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12856b);
  local_41c = 0;
  local_428 = PFData::getZ(&local_260);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (double *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa60);
    testing::AssertionResult::failure_message((AssertionResult *)0x128630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x12868d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1286e5);
  local_44c = 0;
  this_00 = (AssertHelper *)PFData::getY(&local_260);
  local_458 = this_00;
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            (in_stack_fffffffffffffa48,
             (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (double *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  iVar5 = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa5c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffa50 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1287aa);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffffa50,iVar5,
               (char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x128807);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12885f);
  local_47c = 0;
  lhs_expression = (char *)PFData::getX(&local_260);
  iVar5 = 0x189c68;
  local_488 = lhs_expression;
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            (lhs_expression,(char *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (double *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_478);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffa38 =
         (int *)testing::AssertionResult::failure_message((AssertionResult *)0x128924);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffffa50,(int)((ulong)lhs_expression >> 0x20),
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffa40));
    iVar5 = (int)local_490;
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x128981);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1289d9);
  PFData::close(&local_260,iVar5);
  PFData::close(&local_b0,iVar5);
  remove("tests/test_write_file_out.pfb");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (lhs_expression,(char *)CONCAT17(uVar2,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38,
             (int *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  iVar5 = (int)((ulong)lhs_expression >> 0x20);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x128aab);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffffa50,iVar5,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffa40));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffab0,(Message *)CONCAT44(iVar4,uVar6));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa30));
    testing::Message::~Message((Message *)0x128b06);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128b71);
  PFData::~PFData((PFData *)CONCAT17(uVar3,in_stack_fffffffffffffa30));
  PFData::~PFData((PFData *)CONCAT17(uVar3,in_stack_fffffffffffffa30));
  return;
}

Assistant:

TEST_F(PFData_test, setData){
    PFData test = PFData();
    double data[24];
    for (int i =0; i<24; i++){
        data[i] = (double) rand() / 1000;
    }
    test.setR(1);
    test.setQ(1);
    test.setP(1);
    test.setDZ(1.0);
    test.setDY(1.0);
    test.setDX(1.0);
    test.setNZ(1);
    test.setNY(4);
    test.setNX(6);
    test.setData(data);
    test.writeFile("tests/test_write_file_out.pfb");
    PFData test_read = PFData("tests/test_write_file_out.pfb");
    test_read.loadHeader();
    test_read.loadData();
    EXPECT_EQ(1, test_read.getR());
    EXPECT_EQ(1, test_read.getQ());
    EXPECT_EQ(1, test_read.getP());
    EXPECT_EQ(1, test_read.getDZ());
    EXPECT_EQ(1, test_read.getDY());
    EXPECT_EQ(1, test_read.getDX());
    EXPECT_EQ(1, test_read.getNZ());
    EXPECT_EQ(4, test_read.getNY());
    EXPECT_EQ(6, test_read.getNX());
    EXPECT_EQ(0, test_read.getZ());
    EXPECT_EQ(0, test_read.getY());
    EXPECT_EQ(0, test_read.getX());

    test_read.close();
    test.close();
    ASSERT_EQ(0,remove("tests/test_write_file_out.pfb"));
}